

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O3

Instr * __thiscall LowererMD::Simd128LowerSqrt(LowererMD *this,Instr *instr)

{
  Opnd *this_00;
  Opnd *this_01;
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  undefined4 *puVar4;
  Instr *pIVar5;
  
  this_00 = instr->m_dst;
  this_01 = instr->m_src1;
  if (this_00 == (Opnd *)0x0) {
LAB_0066df53:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x390,"(dst && dst->IsRegOpnd())","dst && dst->IsRegOpnd()");
    if (!bVar3) goto LAB_0066e0a7;
    *puVar4 = 0;
  }
  else {
    OVar2 = IR::Opnd::GetKind(this_00);
    if (OVar2 != OpndKindReg) goto LAB_0066df53;
  }
  if (this_01 == (Opnd *)0x0) {
LAB_0066dfba:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x391,"(src1 && src1->IsRegOpnd())","src1 && src1->IsRegOpnd()");
    if (!bVar3) goto LAB_0066e0a7;
    *puVar4 = 0;
  }
  else {
    OVar2 = IR::Opnd::GetKind(this_01);
    if (OVar2 != OpndKindReg) goto LAB_0066dfba;
  }
  if (instr->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x392,"(instr->GetSrc2() == nullptr)","instr->GetSrc2() == nullptr");
    if (!bVar3) {
LAB_0066e0a7:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pIVar5 = IR::Instr::New(SQRTPS,this_00,this_01,this->m_func);
  IR::Instr::InsertBefore(instr,pIVar5);
  pIVar5 = instr->m_prev;
  IR::Instr::Remove(instr);
  return pIVar5;
}

Assistant:

IR::Instr* LowererMD::Simd128LowerSqrt(IR::Instr *instr)
{
    Js::OpCode opcode = Js::OpCode::SQRTPS;

    IR::Opnd *dst, *src1;
    dst = instr->GetDst();
    src1 = instr->GetSrc1();

    Assert(dst && dst->IsRegOpnd());
    Assert(src1 && src1->IsRegOpnd());
    Assert(instr->GetSrc2() == nullptr);
    opcode = Js::OpCode::SQRTPS;
#if 0
    {
        Assert(instr->m_opcode == Js::OpCode::Simd128_Sqrt_D2);
        opcode = Js::OpCode::SQRTPD;
    }
#endif // 0

    instr->InsertBefore(IR::Instr::New(opcode, dst, src1, m_func));
    IR::Instr* prevInstr = instr->m_prev;
    instr->Remove();
    return prevInstr;
}